

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

Vec_Str_t * Scl_LibertyReadSclStr(Scl_Tree_t *p,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p_00;
  Vec_Str_t *vOut_00;
  Scl_Item_t *pSVar3;
  char *pcVar4;
  Vec_Ptr_t *p_01;
  char *Entry;
  char **ppVarNames;
  Vec_Wrd_t *p_02;
  word Val;
  Vec_Ptr_t *pVVar5;
  Vec_Flt_t *p_03;
  abctime aVar6;
  float fVar7;
  double local_158;
  double local_148;
  Vec_Flt_t *vArray;
  Vec_Flt_t *vValues;
  Vec_Flt_t *vInd1;
  Vec_Flt_t *vInd0;
  Vec_Ptr_t *vTimings;
  Vec_Ptr_t *vTables [4];
  float local_a0;
  float CapFall;
  float CapRise;
  float CapOne;
  int nSkipped [4];
  int nCells;
  int nOutputs;
  int Counter;
  int k;
  int i;
  char *pName;
  char *pFormula;
  Vec_Wrd_t *vTruth;
  Scl_Item_t *pTiming;
  Scl_Item_t *pPin;
  Scl_Item_t *pCell;
  Vec_Ptr_t *vTemples;
  Vec_Ptr_t *vNameIns;
  Vec_Str_t *vOut;
  int fUseFirstTable;
  int fVeryVerbose_local;
  int fVerbose_local;
  Scl_Tree_t *p_local;
  
  memset(&CapRise,0,0x10);
  p_00 = Scl_LibertyReadTemplates(p);
  vOut_00 = Vec_StrAlloc(10000);
  Vec_StrPutI_(vOut_00,8);
  Vec_StrPut_(vOut_00);
  pSVar3 = Scl_LibertyRoot(p);
  pcVar4 = Scl_LibertyReadString(p,pSVar3->Head);
  Vec_StrPutS_(vOut_00,pcVar4);
  pcVar4 = Scl_LibertyReadDefaultWireLoad(p);
  Vec_StrPutS_(vOut_00,pcVar4);
  pcVar4 = Scl_LibertyReadDefaultWireLoadSel(p);
  Vec_StrPutS_(vOut_00,pcVar4);
  fVar7 = Scl_LibertyReadDefaultMaxTrans(p);
  Vec_StrPutF_(vOut_00,fVar7);
  iVar1 = Scl_LibertyReadTimeUnit(p);
  Vec_StrPutI_(vOut_00,iVar1);
  Scl_LibertyReadLoadUnit(p,vOut_00);
  Vec_StrPut_(vOut_00);
  Vec_StrPut_(vOut_00);
  Scl_LibertyReadWireLoad(p,vOut_00);
  Scl_LibertyReadWireLoadSelect(p,vOut_00);
  nSkipped[3] = 0;
  pSVar3 = Scl_LibertyRoot(p);
  for (pPin = Scl_LibertyItem(p,pSVar3->Child); pPin != (Scl_Item_t *)0x0;
      pPin = Scl_LibertyItem(p,pPin->Next)) {
    iVar1 = Scl_LibertyCompare(p,pPin->Key,"cell");
    if (iVar1 == 0) {
      iVar1 = Scl_LibertyReadCellIsFlop(p,pPin);
      if (iVar1 == 0) {
        iVar1 = Scl_LibertyReadCellIsDontUse(p,pPin);
        if (iVar1 == 0) {
          iVar1 = Scl_LibertyReadCellIsThreeState(p,pPin);
          if (iVar1 == 0) {
            iVar1 = Scl_LibertyReadCellOutputNum(p,pPin);
            if (iVar1 == 0) {
              if (fVeryVerbose != 0) {
                pcVar4 = Scl_LibertyReadString(p,pPin->Head);
                printf("Scl_LibertyReadGenlib() skipped cell \"%s\" without logic function.\n",
                       pcVar4);
              }
              nSkipped[0] = nSkipped[0] + 1;
            }
            else {
              nSkipped[3] = nSkipped[3] + 1;
            }
          }
          else {
            if (fVeryVerbose != 0) {
              pcVar4 = Scl_LibertyReadString(p,pPin->Head);
              printf("Scl_LibertyReadGenlib() skipped three-state cell \"%s\".\n",pcVar4);
            }
            CapOne = (float)((int)CapOne + 1);
          }
        }
        else {
          if (fVeryVerbose != 0) {
            pcVar4 = Scl_LibertyReadString(p,pPin->Head);
            printf("Scl_LibertyReadGenlib() skipped cell \"%s\" due to dont_use attribute.\n",pcVar4
                  );
          }
          nSkipped[1] = nSkipped[1] + 1;
        }
      }
      else {
        if (fVeryVerbose != 0) {
          pcVar4 = Scl_LibertyReadString(p,pPin->Head);
          printf("Scl_LibertyReadGenlib() skipped sequential cell \"%s\".\n",pcVar4);
        }
        CapRise = (float)((int)CapRise + 1);
      }
    }
  }
  Vec_StrPutI_(vOut_00,nSkipped[3]);
  Vec_StrPut_(vOut_00);
  Vec_StrPut_(vOut_00);
  pSVar3 = Scl_LibertyRoot(p);
  pPin = Scl_LibertyItem(p,pSVar3->Child);
  do {
    if (pPin == (Scl_Item_t *)0x0) {
      if (p_00 != (Vec_Ptr_t *)0x0) {
        iVar1 = Vec_PtrSize(p_00);
        if (iVar1 % 4 != 0) {
          __assert_fail("Vec_PtrSize(vTemples) % 4 == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                        ,0x676,"Vec_Str_t *Scl_LibertyReadSclStr(Scl_Tree_t *, int, int)");
        }
        for (Counter = 0; iVar1 = Vec_PtrSize(p_00), Counter < iVar1; Counter = Counter + 1) {
          p_03 = (Vec_Flt_t *)Vec_PtrEntry(p_00,Counter);
          if (p_03 != (Vec_Flt_t *)0x0) {
            if (Counter % 4 == 0) {
              if (p_03 != (Vec_Flt_t *)0x0) {
                free(p_03);
              }
            }
            else if ((Counter % 4 == 2) || (Counter % 4 == 3)) {
              Vec_FltFree(p_03);
            }
          }
        }
        Vec_PtrFree(p_00);
      }
      if (fVerbose != 0) {
        pSVar3 = Scl_LibertyRoot(p);
        pcVar4 = Scl_LibertyReadString(p,pSVar3->Head);
        printf("Library \"%s\" from \"%s\" has %d cells ",pcVar4,p->pFileName,
               (ulong)(uint)nSkipped[3]);
        printf("(%d skipped: %d seq; %d tri-state; %d no func; %d dont_use).  ",
               (ulong)(uint)((int)CapRise + (int)CapOne + nSkipped[0]),(ulong)(uint)CapRise,
               (ulong)(uint)CapOne,(ulong)(uint)nSkipped[0],(ulong)(uint)nSkipped[1]);
        aVar6 = Abc_Clock();
        Abc_PrintTime(1,"Time",aVar6 - p->clkStart);
      }
      return vOut_00;
    }
    iVar1 = Scl_LibertyCompare(p,pPin->Key,"cell");
    if ((((iVar1 == 0) && (iVar1 = Scl_LibertyReadCellIsFlop(p,pPin), iVar1 == 0)) &&
        (iVar1 = Scl_LibertyReadCellIsDontUse(p,pPin), iVar1 == 0)) &&
       ((iVar1 = Scl_LibertyReadCellIsThreeState(p,pPin), iVar1 == 0 &&
        (iVar1 = Scl_LibertyReadCellOutputNum(p,pPin), iVar1 != 0)))) {
      pcVar4 = Scl_LibertyReadString(p,pPin->Head);
      Vec_StrPutS_(vOut_00,pcVar4);
      pcVar4 = Scl_LibertyReadCellArea(p,pPin);
      if (pcVar4 == (char *)0x0) {
        local_148 = 1.0;
      }
      else {
        local_148 = atof(pcVar4);
      }
      Vec_StrPutF_(vOut_00,(float)local_148);
      pcVar4 = Scl_LibertyReadCellLeakage(p,pPin);
      if (pcVar4 == (char *)0x0) {
        local_158 = 0.0;
      }
      else {
        local_158 = atof(pcVar4);
      }
      Vec_StrPutF_(vOut_00,(float)local_158);
      iVar1 = Scl_LibertyReadDeriveStrength(p,pPin);
      Vec_StrPutI_(vOut_00,iVar1);
      iVar1 = Scl_LibertyReadCellOutputNum(p,pPin);
      iVar2 = Scl_LibertyItemNum(p,pPin,"pin");
      Vec_StrPutI_(vOut_00,iVar2 - iVar1);
      Vec_StrPutI_(vOut_00,iVar1);
      Vec_StrPut_(vOut_00);
      Vec_StrPut_(vOut_00);
      p_01 = Vec_PtrAlloc(0x10);
      for (pTiming = Scl_LibertyItem(p,pPin->Child); pTiming != (Scl_Item_t *)0x0;
          pTiming = Scl_LibertyItem(p,pTiming->Next)) {
        iVar1 = Scl_LibertyCompare(p,pTiming->Key,"pin");
        if ((iVar1 == 0) && (pcVar4 = Scl_LibertyReadPinFormula(p,pTiming), pcVar4 == (char *)0x0))
        {
          iVar1 = Scl_LibertyReadPinDirection(p,pTiming);
          if (iVar1 != 0) {
            __assert_fail("Scl_LibertyReadPinDirection(p, pPin) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                          ,0x5f8,"Vec_Str_t *Scl_LibertyReadSclStr(Scl_Tree_t *, int, int)");
          }
          pcVar4 = Scl_LibertyReadString(p,pTiming->Head);
          Entry = Abc_UtilStrsav(pcVar4);
          Vec_PtrPush(p_01,Entry);
          Vec_StrPutS_(vOut_00,pcVar4);
          fVar7 = Scl_LibertyReadPinCap(p,pTiming,"capacitance");
          local_a0 = Scl_LibertyReadPinCap(p,pTiming,"rise_capacitance");
          vTables[3]._4_4_ = Scl_LibertyReadPinCap(p,pTiming,"fall_capacitance");
          if ((local_a0 == 0.0) && (!NAN(local_a0))) {
            local_a0 = fVar7;
          }
          if ((vTables[3]._4_4_ == 0.0) && (!NAN(vTables[3]._4_4_))) {
            vTables[3]._4_4_ = fVar7;
          }
          Vec_StrPutF_(vOut_00,local_a0);
          Vec_StrPutF_(vOut_00,vTables[3]._4_4_);
          Vec_StrPut_(vOut_00);
        }
      }
      Vec_StrPut_(vOut_00);
      for (pTiming = Scl_LibertyItem(p,pPin->Child); pTiming != (Scl_Item_t *)0x0;
          pTiming = Scl_LibertyItem(p,pTiming->Next)) {
        iVar1 = Scl_LibertyCompare(p,pTiming->Key,"pin");
        if ((iVar1 == 0) && (pcVar4 = Scl_LibertyReadPinFormula(p,pTiming), pcVar4 != (char *)0x0))
        {
          iVar1 = Scl_LibertyReadPinDirection(p,pTiming);
          if (iVar1 != 1) {
            __assert_fail("Scl_LibertyReadPinDirection(p, pPin) == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                          ,0x60d,"Vec_Str_t *Scl_LibertyReadSclStr(Scl_Tree_t *, int, int)");
          }
          pcVar4 = Scl_LibertyReadString(p,pTiming->Head);
          Vec_StrPutS_(vOut_00,pcVar4);
          fVar7 = Scl_LibertyReadPinCap(p,pTiming,"max_capacitance");
          Vec_StrPutF_(vOut_00,fVar7);
          fVar7 = Scl_LibertyReadPinCap(p,pTiming,"max_transition");
          Vec_StrPutF_(vOut_00,fVar7);
          iVar1 = Vec_PtrSize(p_01);
          Vec_StrPutI_(vOut_00,iVar1);
          pcVar4 = Scl_LibertyReadPinFormula(p,pTiming);
          Vec_StrPutS_(vOut_00,pcVar4);
          ppVarNames = (char **)Vec_PtrArray(p_01);
          iVar1 = Vec_PtrSize(p_01);
          p_02 = Mio_ParseFormulaTruth(pcVar4,ppVarNames,iVar1);
          if (p_02 == (Vec_Wrd_t *)0x0) {
            return (Vec_Str_t *)0x0;
          }
          Counter = 0;
          while( true ) {
            iVar1 = Vec_PtrSize(p_01);
            iVar1 = Abc_Truth6WordNum(iVar1);
            if (iVar1 <= Counter) break;
            Val = Vec_WrdEntry(p_02,Counter);
            Vec_StrPutW_(vOut_00,Val);
            Counter = Counter + 1;
          }
          Vec_WrdFree(p_02);
          Vec_StrPut_(vOut_00);
          Vec_StrPut_(vOut_00);
          for (Counter = 0; iVar1 = Vec_PtrSize(p_01), Counter < iVar1; Counter = Counter + 1) {
            pcVar4 = (char *)Vec_PtrEntry(p_01,Counter);
            vInd0 = (Vec_Flt_t *)Scl_LibertyReadPinTimingAll(p,pTiming,pcVar4);
            Vec_StrPutS_(vOut_00,pcVar4);
            iVar1 = Vec_PtrSize((Vec_Ptr_t *)vInd0);
            Vec_StrPutI_(vOut_00,(uint)(iVar1 != 0));
            iVar1 = Vec_PtrSize((Vec_Ptr_t *)vInd0);
            if (iVar1 == 0) {
              Vec_PtrFree((Vec_Ptr_t *)vInd0);
            }
            else {
              pSVar3 = (Scl_Item_t *)Vec_PtrEntry((Vec_Ptr_t *)vInd0,0);
              iVar1 = Scl_LibertyReadTimingSense(p,pSVar3);
              Vec_StrPutI_(vOut_00,iVar1);
              Vec_StrPut_(vOut_00);
              Vec_StrPut_(vOut_00);
              for (nOutputs = 0; nOutputs < 4; nOutputs = nOutputs + 1) {
                pVVar5 = Vec_PtrAlloc(0x10);
                vTables[(long)nOutputs + -1] = pVVar5;
              }
              for (nOutputs = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)vInd0), nOutputs < iVar1;
                  nOutputs = nOutputs + 1) {
                pSVar3 = (Scl_Item_t *)Vec_PtrEntry((Vec_Ptr_t *)vInd0,nOutputs);
                iVar1 = Scl_LibertyScanTable(p,vTimings,pSVar3,"cell_rise",p_00);
                if ((iVar1 == 0) &&
                   (iVar1 = Scl_LibertyScanTable(p,vTimings,pSVar3,"cell_fall",p_00), iVar1 == 0)) {
                  printf("Table cannot be found\n");
                  return (Vec_Str_t *)0x0;
                }
                iVar1 = Scl_LibertyScanTable(p,vTables[0],pSVar3,"cell_fall",p_00);
                if ((iVar1 == 0) &&
                   (iVar1 = Scl_LibertyScanTable(p,vTables[0],pSVar3,"cell_rise",p_00), iVar1 == 0))
                {
                  printf("Table cannot be found\n");
                  return (Vec_Str_t *)0x0;
                }
                iVar1 = Scl_LibertyScanTable(p,vTables[1],pSVar3,"rise_transition",p_00);
                if ((iVar1 == 0) &&
                   (iVar1 = Scl_LibertyScanTable(p,vTables[1],pSVar3,"fall_transition",p_00),
                   iVar1 == 0)) {
                  printf("Table cannot be found\n");
                  return (Vec_Str_t *)0x0;
                }
                iVar1 = Scl_LibertyScanTable(p,vTables[2],pSVar3,"fall_transition",p_00);
                if ((iVar1 == 0) &&
                   (iVar1 = Scl_LibertyScanTable(p,vTables[2],pSVar3,"rise_transition",p_00),
                   iVar1 == 0)) {
                  printf("Table cannot be found\n");
                  return (Vec_Str_t *)0x0;
                }
              }
              Vec_PtrFree((Vec_Ptr_t *)vInd0);
              for (nOutputs = 0; nOutputs < 4; nOutputs = nOutputs + 1) {
                iVar1 = Scl_LibertyComputeWorstCase
                                  (vTables[(long)nOutputs + -1],&vInd1,&vValues,&vArray);
                if (iVar1 == 0) {
                  printf("Table indexes have different values\n");
                  return (Vec_Str_t *)0x0;
                }
                Vec_VecFree((Vec_Vec_t *)vTables[(long)nOutputs + -1]);
                Scl_LibertyDumpTables(vOut_00,vInd1,vValues,vArray);
                Vec_FltFree(vInd1);
                Vec_FltFree(vValues);
                Vec_FltFree(vArray);
              }
            }
          }
        }
      }
      Vec_StrPut_(vOut_00);
      Vec_PtrFreeFree(p_01);
    }
    pPin = Scl_LibertyItem(p,pPin->Next);
  } while( true );
}

Assistant:

Vec_Str_t * Scl_LibertyReadSclStr( Scl_Tree_t * p, int fVerbose, int fVeryVerbose )
{
    int fUseFirstTable = 0;
    Vec_Str_t * vOut;
    Vec_Ptr_t * vNameIns, * vTemples = NULL;
    Scl_Item_t * pCell, * pPin, * pTiming;
    Vec_Wrd_t * vTruth;
    char * pFormula, * pName;
    int i, k, Counter, nOutputs, nCells;
    int nSkipped[4] = {0};

    // read delay-table templates
    vTemples = Scl_LibertyReadTemplates( p );

    // start the library
    vOut = Vec_StrAlloc( 10000 );
    Vec_StrPutI_( vOut, ABC_SCL_CUR_VERSION );

    // top level information
    Vec_StrPut_( vOut );
    Vec_StrPutS_( vOut, Scl_LibertyReadString(p, Scl_LibertyRoot(p)->Head) );
    Vec_StrPutS_( vOut, Scl_LibertyReadDefaultWireLoad(p) );
    Vec_StrPutS_( vOut, Scl_LibertyReadDefaultWireLoadSel(p) );
    Vec_StrPutF_( vOut, Scl_LibertyReadDefaultMaxTrans(p) );
    Vec_StrPutI_( vOut, Scl_LibertyReadTimeUnit(p) );
    Scl_LibertyReadLoadUnit( p, vOut );
    Vec_StrPut_( vOut );
    Vec_StrPut_( vOut );

    // read wire loads
    Scl_LibertyReadWireLoad( p, vOut );
    Scl_LibertyReadWireLoadSelect( p, vOut );

    // count cells
    nCells = 0;
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pCell, "cell" )
    {
        if ( Scl_LibertyReadCellIsFlop(p, pCell) )
        {
            if ( fVeryVerbose )  printf( "Scl_LibertyReadGenlib() skipped sequential cell \"%s\".\n", Scl_LibertyReadString(p, pCell->Head) );
            nSkipped[0]++;
            continue;
        }
        if ( Scl_LibertyReadCellIsDontUse(p, pCell) )
        {
            if ( fVeryVerbose )  printf( "Scl_LibertyReadGenlib() skipped cell \"%s\" due to dont_use attribute.\n", Scl_LibertyReadString(p, pCell->Head) );
            nSkipped[3]++;
            continue;
        }
        if ( Scl_LibertyReadCellIsThreeState(p, pCell) )
        {
            if ( fVeryVerbose )  printf( "Scl_LibertyReadGenlib() skipped three-state cell \"%s\".\n", Scl_LibertyReadString(p, pCell->Head) );
            nSkipped[1]++;
            continue;
        }
        if ( (Counter = Scl_LibertyReadCellOutputNum(p, pCell)) == 0 )
        {
            if ( fVeryVerbose )  printf( "Scl_LibertyReadGenlib() skipped cell \"%s\" without logic function.\n", Scl_LibertyReadString(p, pCell->Head) );
            nSkipped[2]++;
            continue;
        }
        nCells++;
    }
    // read cells
    Vec_StrPutI_( vOut, nCells );
    Vec_StrPut_( vOut );
    Vec_StrPut_( vOut );
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pCell, "cell" )
    {
        if ( Scl_LibertyReadCellIsFlop(p, pCell) )
            continue;
        if ( Scl_LibertyReadCellIsDontUse(p, pCell) )
            continue;
        if ( Scl_LibertyReadCellIsThreeState(p, pCell) )
            continue;
        if ( (Counter = Scl_LibertyReadCellOutputNum(p, pCell)) == 0 )
            continue;
        // top level information
        Vec_StrPutS_( vOut, Scl_LibertyReadString(p, pCell->Head) );
        pName = Scl_LibertyReadCellArea(p, pCell);
        Vec_StrPutF_( vOut, pName ? atof(pName) : 1 );
        pName = Scl_LibertyReadCellLeakage(p, pCell);
        Vec_StrPutF_( vOut, pName ? atof(pName) : 0 );
        Vec_StrPutI_( vOut, Scl_LibertyReadDeriveStrength(p, pCell) );
        // pin count
        nOutputs = Scl_LibertyReadCellOutputNum( p, pCell );
        Vec_StrPutI_( vOut, Scl_LibertyItemNum(p, pCell, "pin") - nOutputs );
        Vec_StrPutI_( vOut, nOutputs );
        Vec_StrPut_( vOut );
        Vec_StrPut_( vOut );

        // input pins
        vNameIns = Vec_PtrAlloc( 16 );
        Scl_ItemForEachChildName( p, pCell, pPin, "pin" )
        {
            float CapOne, CapRise, CapFall;
            if ( Scl_LibertyReadPinFormula(p, pPin) != NULL ) // skip output pin
                continue;
            assert( Scl_LibertyReadPinDirection(p, pPin) == 0 );
            pName = Scl_LibertyReadString(p, pPin->Head);
            Vec_PtrPush( vNameIns, Abc_UtilStrsav(pName) );
            Vec_StrPutS_( vOut, pName );
            CapOne  = Scl_LibertyReadPinCap( p, pPin, "capacitance" );
            CapRise = Scl_LibertyReadPinCap( p, pPin, "rise_capacitance" );
            CapFall = Scl_LibertyReadPinCap( p, pPin, "fall_capacitance" );
            if ( CapRise == 0 )
                CapRise = CapOne;
            if ( CapFall == 0 )
                CapFall = CapOne;
            Vec_StrPutF_( vOut, CapRise );
            Vec_StrPutF_( vOut, CapFall );
            Vec_StrPut_( vOut );
        }
        Vec_StrPut_( vOut );
        // output pins
        Scl_ItemForEachChildName( p, pCell, pPin, "pin" )
        {
            if ( !Scl_LibertyReadPinFormula(p, pPin) ) // skip input pin
                continue;
            assert( Scl_LibertyReadPinDirection(p, pPin) == 1 );
            pName = Scl_LibertyReadString(p, pPin->Head);
            Vec_StrPutS_( vOut, pName );
            Vec_StrPutF_( vOut, Scl_LibertyReadPinCap( p, pPin, "max_capacitance" ) );
            Vec_StrPutF_( vOut, Scl_LibertyReadPinCap( p, pPin, "max_transition" ) );
            Vec_StrPutI_( vOut, Vec_PtrSize(vNameIns) );
            pFormula = Scl_LibertyReadPinFormula(p, pPin);
            Vec_StrPutS_( vOut, pFormula );
            // write truth table
            vTruth = Mio_ParseFormulaTruth( pFormula, (char **)Vec_PtrArray(vNameIns), Vec_PtrSize(vNameIns) );
            if ( vTruth == NULL )
                return NULL;
            for ( i = 0; i < Abc_Truth6WordNum(Vec_PtrSize(vNameIns)); i++ )
                Vec_StrPutW_( vOut, Vec_WrdEntry(vTruth, i) );
            Vec_WrdFree( vTruth );
            Vec_StrPut_( vOut );
            Vec_StrPut_( vOut );

            // write the delay tables
            if ( fUseFirstTable )
            {
                Vec_PtrForEachEntry( char *, vNameIns, pName, i )
                {
                    pTiming = Scl_LibertyReadPinTiming( p, pPin, pName );
                    Vec_StrPutS_( vOut, pName );
                    Vec_StrPutI_( vOut, (int)(pTiming != NULL) );
                    if ( pTiming == NULL ) // output does not depend on input
                        continue;
                    Vec_StrPutI_( vOut, Scl_LibertyReadTimingSense(p, pTiming) );
                    Vec_StrPut_( vOut );
                    Vec_StrPut_( vOut );
                    // some cells only have 'rise' or 'fall' but not both - here we work around this
                    if ( !Scl_LibertyReadTable( p, vOut, pTiming, "cell_rise",           vTemples ) )
                        if ( !Scl_LibertyReadTable( p, vOut, pTiming, "cell_fall",       vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyReadTable( p, vOut, pTiming, "cell_fall",           vTemples ) )
                        if ( !Scl_LibertyReadTable( p, vOut, pTiming, "cell_rise",       vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyReadTable( p, vOut, pTiming, "rise_transition",     vTemples ) )
                        if ( !Scl_LibertyReadTable( p, vOut, pTiming, "fall_transition", vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyReadTable( p, vOut, pTiming, "fall_transition",     vTemples ) )
                        if ( !Scl_LibertyReadTable( p, vOut, pTiming, "rise_transition", vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }  
                }
                continue;
            }

            // write the timing tables
            Vec_PtrForEachEntry( char *, vNameIns, pName, i )
            {
                Vec_Ptr_t * vTables[4];
                Vec_Ptr_t * vTimings;
                vTimings = Scl_LibertyReadPinTimingAll( p, pPin, pName );
                Vec_StrPutS_( vOut, pName );
                Vec_StrPutI_( vOut, (int)(Vec_PtrSize(vTimings) != 0) );
                if ( Vec_PtrSize(vTimings) == 0 ) // output does not depend on input
                {
                    Vec_PtrFree( vTimings );
                    continue;
                }
                Vec_StrPutI_( vOut, Scl_LibertyReadTimingSense(p, (Scl_Item_t *)Vec_PtrEntry(vTimings, 0)) );
                Vec_StrPut_( vOut );
                Vec_StrPut_( vOut );
                // collect the timing tables
                for ( k = 0; k < 4; k++ )
                    vTables[k] = Vec_PtrAlloc( 16 );
                Vec_PtrForEachEntry( Scl_Item_t *, vTimings, pTiming, k )
                {
                    // some cells only have 'rise' or 'fall' but not both - here we work around this
                    if ( !Scl_LibertyScanTable( p, vTables[0], pTiming, "cell_rise",           vTemples ) )
                        if ( !Scl_LibertyScanTable( p, vTables[0], pTiming, "cell_fall",       vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyScanTable( p, vTables[1], pTiming, "cell_fall",           vTemples ) )
                        if ( !Scl_LibertyScanTable( p, vTables[1], pTiming, "cell_rise",       vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyScanTable( p, vTables[2], pTiming, "rise_transition",     vTemples ) )
                        if ( !Scl_LibertyScanTable( p, vTables[2], pTiming, "fall_transition", vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyScanTable( p, vTables[3], pTiming, "fall_transition",     vTemples ) )
                        if ( !Scl_LibertyScanTable( p, vTables[3], pTiming, "rise_transition", vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }  
                }
                Vec_PtrFree( vTimings );
                // compute worse case of the tables
                for ( k = 0; k < 4; k++ )
                {
                    Vec_Flt_t * vInd0, * vInd1, * vValues;
                    if ( !Scl_LibertyComputeWorstCase( vTables[k], &vInd0, &vInd1, &vValues ) )
                        { printf( "Table indexes have different values\n" ); return NULL; }  
                    Vec_VecFree( (Vec_Vec_t *)vTables[k] );
                    Scl_LibertyDumpTables( vOut, vInd0, vInd1, vValues );
                    Vec_FltFree( vInd0 );
                    Vec_FltFree( vInd1 );
                    Vec_FltFree( vValues );
                }
            }
        }
        Vec_StrPut_( vOut );
        Vec_PtrFreeFree( vNameIns );
    }
    // free templates
    if ( vTemples )
    {
        Vec_Flt_t * vArray;
        assert( Vec_PtrSize(vTemples) % 4 == 0 );
        Vec_PtrForEachEntry( Vec_Flt_t *, vTemples, vArray, i )
        {
            if ( vArray == NULL )
                continue;
            if ( i % 4 == 0 )
                ABC_FREE( vArray );
            else if ( i % 4 == 2 || i % 4 == 3 )
                Vec_FltFree( vArray );
        }
        Vec_PtrFree( vTemples );
    }
    if ( fVerbose )
    {
        printf( "Library \"%s\" from \"%s\" has %d cells ", 
            Scl_LibertyReadString(p, Scl_LibertyRoot(p)->Head), p->pFileName, nCells );
        printf( "(%d skipped: %d seq; %d tri-state; %d no func; %d dont_use).  ", 
            nSkipped[0]+nSkipped[1]+nSkipped[2], nSkipped[0], nSkipped[1], nSkipped[2], nSkipped[3] );
        Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    }
    return vOut;
}